

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadMeshSkeletonLink(OgreBinarySerializer *this,Mesh *mesh)

{
  string local_30;
  
  ReadLine_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=((string *)&mesh->skeletonRef,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadMeshSkeletonLink(Mesh *mesh)
{
    mesh->skeletonRef = ReadLine();
}